

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void radio_draw_io(t_radio *x,_glist *glist,int old_snd_rcv_flags)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  _glist *p_Var4;
  int local_1f4;
  char *pcStack_1e8;
  int height;
  char *tags [2];
  char tag [128];
  char tag_but [128];
  char tag_object [128];
  _glist *canvas;
  int ioh;
  int iow;
  int ypos;
  int xpos;
  int zoom;
  int old_snd_rcv_flags_local;
  _glist *glist_local;
  t_radio *x_local;
  
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  uVar2 = text_xpix((t_text *)x,glist);
  iVar3 = text_ypix((t_text *)x,glist);
  p_Var4 = glist_getcanvas(glist);
  pcStack_1e8 = tag_but + 0x78;
  tags[0] = (char *)(tags + 1);
  sprintf(tag_but + 0x78,"%lxOBJ",x);
  sprintf(tag + 0x78,"%lxBUT",x);
  sprintf((char *)(tags + 1),"%lxOUT%d",x,0);
  pdgui_vmess((char *)0x0,"crs",p_Var4,"delete",tags + 1);
  if (((uint)(x->x_gui).x_fsf >> 7 & 1) == 0) {
    if (x->x_orientation == horizontal) {
      local_1f4 = 1;
    }
    else {
      local_1f4 = x->x_number;
    }
    local_1f4 = (x->x_gui).x_h * local_1f4;
    pdgui_vmess((char *)0x0,"crr iiii rs rS",p_Var4,"create","rectangle",(ulong)uVar2,
                iVar3 + local_1f4 + iVar1 * -2,uVar2 + iVar1 * 7,iVar3 + local_1f4,"-fill","black",
                "-tags",2,&stack0xfffffffffffffe18);
    pdgui_vmess((char *)0x0,"crss",p_Var4,"lower",tags + 1,tag + 0x78);
  }
  sprintf((char *)(tags + 1),"%lxIN%d",x,0);
  pdgui_vmess((char *)0x0,"crs",p_Var4,"delete",tags + 1);
  if (((uint)(x->x_gui).x_fsf >> 6 & 1) == 0) {
    pdgui_vmess((char *)0x0,"crr iiii rs rS",p_Var4,"create","rectangle",(ulong)uVar2,iVar3,
                uVar2 + iVar1 * 7,iVar3 + iVar1 * 2,"-fill","black","-tags",2,
                &stack0xfffffffffffffe18);
    pdgui_vmess((char *)0x0,"crss",p_Var4,"lower",tags + 1,tag + 0x78);
  }
  return;
}

Assistant:

static void radio_draw_io(t_radio* x, t_glist* glist, int old_snd_rcv_flags)
{
    const int zoom = IEMGUI_ZOOM(x);
    int xpos = text_xpix(&x->x_gui.x_obj, glist);
    int ypos = text_ypix(&x->x_gui.x_obj, glist);
    int iow = IOWIDTH * zoom, ioh = IEM_GUI_IOHEIGHT * zoom;
    t_canvas *canvas = glist_getcanvas(glist);
    char tag_object[128], tag_but[128], tag[128];
    char *tags[] = {tag_object, tag};

    (void)old_snd_rcv_flags;

    sprintf(tag_object, "%lxOBJ", x);
    sprintf(tag_but, "%lxBUT", x);

    sprintf(tag, "%lxOUT%d", x, 0);
    pdgui_vmess(0, "crs", canvas, "delete", tag);
    if(!x->x_gui.x_fsf.x_snd_able)
    {
        int height = x->x_gui.x_h * ((x->x_orientation == horizontal)? 1: x->x_number);
        pdgui_vmess(0, "crr iiii rs rS", canvas, "create", "rectangle",
            xpos, ypos + height + zoom - ioh,
            xpos + iow, ypos + height,
            "-fill", "black",
            "-tags", 2, tags);

            /* keep buttons above outlet */
        pdgui_vmess(0, "crss", canvas, "lower", tag, tag_but);
    }

    sprintf(tag, "%lxIN%d", x, 0);
    pdgui_vmess(0, "crs", canvas, "delete", tag);
    if(!x->x_gui.x_fsf.x_rcv_able)
    {
        pdgui_vmess(0, "crr iiii rs rS", canvas, "create", "rectangle",
            xpos, ypos,
            xpos + iow, ypos - zoom + ioh,
            "-fill", "black",
            "-tags", 2, tags);

            /* keep buttons above inlet */
        pdgui_vmess(0, "crss", canvas, "lower", tag, tag_but);
    }
}